

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::reset_ctrl_values(Group *this)

{
  this->c_act_thr_changes = 0;
  this->acc_c_act_thr = 0.0;
  this->c_sln_thr_changes = 0;
  this->acc_c_sln_thr = 0.0;
  this->c_act_changes = 0;
  this->acc_c_act = 0.0;
  this->c_sln_changes = 0;
  this->acc_c_sln = 0.0;
  this->vis_thr_changes = 0;
  this->acc_vis_thr = 0.0;
  this->act_thr_changes = 0;
  this->acc_act_thr = 0.0;
  this->sln_thr_changes = 0;
  this->acc_sln_thr = 0.0;
  return;
}

Assistant:

void Group::reset_ctrl_values()
{
    sln_thr_changes = 0;
    acc_sln_thr = 0;
    act_thr_changes = 0;
    acc_act_thr = 0;
    vis_thr_changes = 0;
    acc_vis_thr = 0;
    c_sln_changes = 0;
    acc_c_sln = 0;
    c_act_changes = 0;
    acc_c_act = 0;
    c_sln_thr_changes = 0;
    acc_c_sln_thr = 0;
    c_act_thr_changes = 0;
    acc_c_act_thr = 0;
}